

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  ImDrawFlags flags_local;
  float rounding_local;
  ImU32 col_local;
  ImVec2 *p_max_local;
  ImVec2 *p_min_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    if ((rounding <= 0.0) || ((flags & 0x1f0U) == 0x100)) {
      PrimReserve(this,6,4);
      PrimRect(this,p_min,p_max,col);
    }
    else {
      PathRect(this,p_min,p_max,rounding,flags);
      PathFillConvex(this,col);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PrimReserve(6, 4);
        PrimRect(p_min, p_max, col);
    }
    else
    {
        PathRect(p_min, p_max, rounding, flags);
        PathFillConvex(col);
    }
}